

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::ExpressionLhs<unsigned_long_const&>::captureExpression<(Catch::Internal::Operator)0,int>
          (ExpressionLhs<unsigned_long_const&> *this,int *rhs)

{
  ResultBuilder *pRVar1;
  int value;
  unsigned_long value_00;
  string local_80;
  string local_60;
  string local_40;
  
  pRVar1 = ResultBuilder::setResultType
                     (*(ResultBuilder **)this,**(ulong **)(this + 8) == (ulong)(uint)*rhs);
  Catch::toString_abi_cxx11_(&local_80,(Catch *)**(undefined8 **)(this + 8),value_00);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_80);
  Catch::toString_abi_cxx11_(&local_60,(Catch *)(ulong)(uint)*rhs,value);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_60);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"==","");
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression(RhsT const& rhs) {
			return m_rb
				.setResultType(Internal::compare<Op>(m_lhs, rhs))
				.setLhs(Catch::toString(m_lhs))
				.setRhs(Catch::toString(rhs))
				.setOp(Internal::OperatorTraits<Op>::getName());
		}